

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_tests.cpp
# Opt level: O0

void __thiscall logging_tests::logging_SeverityLevels::test_method(logging_SeverityLevels *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string_view level_str;
  string_view category_str;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  bool bVar1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  left_begin;
  istream *piVar2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_RDI;
  long in_FS_OFFSET;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  log_lines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expected;
  string log;
  ifstream file;
  Logger *in_stack_fffffffffffff9e8;
  undefined4 uVar3;
  char *in_stack_fffffffffffff9f0;
  char *in_stack_fffffffffffff9f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa00;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffa08;
  const_string *in_stack_fffffffffffffa10;
  Logger *in_stack_fffffffffffffa18;
  undefined7 in_stack_fffffffffffffa20;
  undefined1 in_stack_fffffffffffffa27;
  lazy_ostream *in_stack_fffffffffffffa28;
  iterator in_stack_fffffffffffffa30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa38;
  LogFlags in_stack_fffffffffffffa50;
  undefined4 in_stack_fffffffffffffa58;
  int in_stack_fffffffffffffa5c;
  char *in_stack_fffffffffffffa60;
  undefined1 in_stack_fffffffffffffa68 [15];
  undefined1 in_stack_fffffffffffffa77;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_570;
  ConstevalFormatString<1U> in_stack_fffffffffffffa98;
  size_t in_stack_fffffffffffffaa0;
  char *in_stack_fffffffffffffaa8;
  equal_coll_impl *this_00;
  size_t in_stack_fffffffffffffab0;
  char *in_stack_fffffffffffffab8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  right_end;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  right_begin;
  Level in_stack_fffffffffffffb90;
  char (*in_stack_fffffffffffffba0) [5];
  assertion_result local_440 [3];
  equal_coll_impl local_3ed;
  allocator<char> local_3ec;
  allocator<char> local_3eb;
  allocator<char> local_3ea;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e9 [8];
  string local_2d0 [32];
  istream local_2b0 [520];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [5];
  _Alloc_hider local_8;
  
  local_8._M_p = *(pointer *)(in_FS_OFFSET + 0x28);
  LogInstance();
  BCLog::Logger::EnableCategory
            (in_stack_fffffffffffff9e8,
             I2P|VALIDATION|QT|COINDB|LIBEVENT|MEMPOOLREJ|PRUNE|RAND|CMPCTBLOCK|SELECTCOINS|ADDRMAN|
             RPC|HTTP);
  LogInstance();
  BCLog::Logger::SetLogLevel(in_stack_fffffffffffff9e8,Trace);
  left_begin._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)LogInstance();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffa08,(char *)in_stack_fffffffffffffa00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffa08,(char *)in_stack_fffffffffffffa00);
  category_str._M_str._7_1_ = in_stack_fffffffffffffa77;
  category_str._0_15_ = in_stack_fffffffffffffa68;
  level_str._M_len._4_4_ = in_stack_fffffffffffffa5c;
  level_str._M_len._0_4_ = in_stack_fffffffffffffa58;
  level_str._M_str = in_stack_fffffffffffffa60;
  BCLog::Logger::SetCategoryLogLevel(in_stack_fffffffffffffa18,category_str,level_str);
  bVar1 = ::LogAcceptCategory((LogFlags)in_stack_fffffffffffff9e8,Trace);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffa08,(char *)in_stack_fffffffffffffa00);
    uVar3 = (undefined4)((ulong)in_stack_fffffffffffff9e8 >> 0x20);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffa08,(char *)in_stack_fffffffffffffa00);
    in_stack_fffffffffffff9e8 = (Logger *)CONCAT44(uVar3,2);
    in_stack_fffffffffffff9f0 = "foo1: %s\n";
    in_stack_fffffffffffff9f8 = "bar1";
    logging_function._M_str = in_stack_fffffffffffffab8;
    logging_function._M_len = in_stack_fffffffffffffab0;
    source_file._M_str = in_stack_fffffffffffffaa8;
    source_file._M_len = in_stack_fffffffffffffaa0;
    LogPrintFormatInternal<char[5]>
              (logging_function,source_file,in_stack_fffffffffffffa5c,in_stack_fffffffffffffa50,
               in_stack_fffffffffffffb90,in_stack_fffffffffffffa98,in_stack_fffffffffffffba0);
  }
  bVar1 = ::LogAcceptCategory((LogFlags)in_stack_fffffffffffff9e8,Trace);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffa08,(char *)in_stack_fffffffffffffa00);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffa08,(char *)in_stack_fffffffffffffa00);
    in_stack_fffffffffffff9e8 = (Logger *)((ulong)in_stack_fffffffffffff9e8 & 0xffffffff00000000);
    in_stack_fffffffffffff9f0 = "foo2: %s. This log level is lower than the global one.\n";
    in_stack_fffffffffffff9f8 = "bar2";
    logging_function_00._M_str = in_stack_fffffffffffffab8;
    logging_function_00._M_len = in_stack_fffffffffffffab0;
    source_file_00._M_str = in_stack_fffffffffffffaa8;
    source_file_00._M_len = in_stack_fffffffffffffaa0;
    LogPrintFormatInternal<char[5]>
              (logging_function_00,source_file_00,in_stack_fffffffffffffa5c,
               in_stack_fffffffffffffa50,in_stack_fffffffffffffb90,in_stack_fffffffffffffa98,
               in_stack_fffffffffffffba0);
  }
  bVar1 = ::LogAcceptCategory((LogFlags)in_stack_fffffffffffff9e8,Trace);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffa08,(char *)in_stack_fffffffffffffa00);
    uVar3 = (undefined4)((ulong)in_stack_fffffffffffff9e8 >> 0x20);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffa08,(char *)in_stack_fffffffffffffa00);
    in_stack_fffffffffffff9e8 = (Logger *)CONCAT44(uVar3,3);
    in_stack_fffffffffffff9f0 = "foo3: %s\n";
    in_stack_fffffffffffff9f8 = "bar3";
    logging_function_01._M_str = in_stack_fffffffffffffab8;
    logging_function_01._M_len = in_stack_fffffffffffffab0;
    source_file_01._M_str = in_stack_fffffffffffffaa8;
    source_file_01._M_len = in_stack_fffffffffffffaa0;
    LogPrintFormatInternal<char[5]>
              (logging_function_01,source_file_01,in_stack_fffffffffffffa5c,
               in_stack_fffffffffffffa50,in_stack_fffffffffffffb90,in_stack_fffffffffffffa98,
               in_stack_fffffffffffffba0);
  }
  bVar1 = ::LogAcceptCategory((LogFlags)in_stack_fffffffffffff9e8,Trace);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffa08,(char *)in_stack_fffffffffffffa00);
    uVar3 = (undefined4)((ulong)in_stack_fffffffffffff9e8 >> 0x20);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffa08,(char *)in_stack_fffffffffffffa00);
    in_stack_fffffffffffff9e8 = (Logger *)CONCAT44(uVar3,4);
    in_stack_fffffffffffff9f0 = "foo4: %s\n";
    in_stack_fffffffffffff9f8 = "bar4";
    logging_function_02._M_str = in_stack_fffffffffffffab8;
    logging_function_02._M_len = in_stack_fffffffffffffab0;
    source_file_02._M_str = in_stack_fffffffffffffaa8;
    source_file_02._M_len = in_stack_fffffffffffffaa0;
    LogPrintFormatInternal<char[5]>
              (logging_function_02,source_file_02,in_stack_fffffffffffffa5c,
               in_stack_fffffffffffffa50,in_stack_fffffffffffffb90,in_stack_fffffffffffffa98,
               in_stack_fffffffffffffba0);
  }
  bVar1 = ::LogAcceptCategory((LogFlags)in_stack_fffffffffffff9e8,Trace);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffa08,(char *)in_stack_fffffffffffffa00);
    uVar3 = (undefined4)((ulong)in_stack_fffffffffffff9e8 >> 0x20);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffa08,(char *)in_stack_fffffffffffffa00);
    in_stack_fffffffffffff9e8 = (Logger *)CONCAT44(uVar3,3);
    in_stack_fffffffffffff9f0 = "foo5: %s\n";
    in_stack_fffffffffffff9f8 = "bar5";
    logging_function_03._M_str = in_stack_fffffffffffffab8;
    logging_function_03._M_len = in_stack_fffffffffffffab0;
    source_file_03._M_str = in_stack_fffffffffffffaa8;
    source_file_03._M_len = in_stack_fffffffffffffaa0;
    LogPrintFormatInternal<char[5]>
              (logging_function_03,source_file_03,in_stack_fffffffffffffa5c,
               in_stack_fffffffffffffa50,in_stack_fffffffffffffb90,in_stack_fffffffffffffa98,
               in_stack_fffffffffffffba0);
  }
  bVar1 = ::LogAcceptCategory((LogFlags)in_stack_fffffffffffff9e8,Trace);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffa08,(char *)in_stack_fffffffffffffa00);
    uVar3 = (undefined4)((ulong)in_stack_fffffffffffff9e8 >> 0x20);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffa08,(char *)in_stack_fffffffffffffa00);
    in_stack_fffffffffffff9e8 = (Logger *)CONCAT44(uVar3,1);
    in_stack_fffffffffffff9f0 =
         "foo6: %s. This log level is the same as the global one but lower than the category-specific one, which takes precedence. \n"
    ;
    in_stack_fffffffffffff9f8 = "bar6";
    logging_function_04._M_str = in_stack_fffffffffffffab8;
    logging_function_04._M_len = in_stack_fffffffffffffab0;
    source_file_04._M_str = in_stack_fffffffffffffaa8;
    source_file_04._M_len = in_stack_fffffffffffffaa0;
    LogPrintFormatInternal<char[5]>
              (logging_function_04,source_file_04,in_stack_fffffffffffffa5c,
               in_stack_fffffffffffffa50,in_stack_fffffffffffffb90,in_stack_fffffffffffffa98,
               in_stack_fffffffffffffba0);
  }
  bVar1 = ::LogAcceptCategory((LogFlags)in_stack_fffffffffffff9e8,Trace);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffa08,(char *)in_stack_fffffffffffffa00);
    uVar3 = (undefined4)((ulong)in_stack_fffffffffffff9e8 >> 0x20);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffa08,(char *)in_stack_fffffffffffffa00);
    in_stack_fffffffffffff9e8 = (Logger *)CONCAT44(uVar3,4);
    in_stack_fffffffffffff9f0 = "foo7: %s\n";
    in_stack_fffffffffffff9f8 = "bar7";
    logging_function_05._M_str = in_stack_fffffffffffffab8;
    logging_function_05._M_len = in_stack_fffffffffffffab0;
    source_file_05._M_str = in_stack_fffffffffffffaa8;
    source_file_05._M_len = in_stack_fffffffffffffaa0;
    LogPrintFormatInternal<char[5]>
              (logging_function_05,source_file_05,in_stack_fffffffffffffa5c,
               in_stack_fffffffffffffa50,in_stack_fffffffffffffb90,in_stack_fffffffffffffa98,
               in_stack_fffffffffffffba0);
  }
  right_end._M_current = local_a8;
  right_begin._M_current = local_3e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa38,(char *)in_stack_fffffffffffffa30,
             (allocator<char> *)in_stack_fffffffffffffa28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa38,(char *)in_stack_fffffffffffffa30,
             (allocator<char> *)in_stack_fffffffffffffa28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa38,(char *)in_stack_fffffffffffffa30,
             (allocator<char> *)in_stack_fffffffffffffa28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa38,(char *)in_stack_fffffffffffffa30,
             (allocator<char> *)in_stack_fffffffffffffa28);
  this_00 = &local_3ed;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa38,(char *)in_stack_fffffffffffffa30,
             (allocator<char> *)in_stack_fffffffffffffa28);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_fffffffffffff9e8);
  __l._M_len = (size_type)in_stack_fffffffffffffa38;
  __l._M_array = in_stack_fffffffffffffa30;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffa28,__l,
           (allocator_type *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffff9e8);
  local_570 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &stack0xfffffffffffffff8;
  do {
    local_570 = local_570 + -1;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff9e8);
  } while (local_570 != local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3ed);
  std::allocator<char>::~allocator(&local_3ec);
  std::allocator<char>::~allocator(&local_3eb);
  std::allocator<char>::~allocator(&local_3ea);
  std::allocator<char>::~allocator((allocator<char> *)local_3e9);
  std::ifstream::ifstream<fs::path,fs::path>
            ((basic_ifstream<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9f8,
             (path *)in_stack_fffffffffffff9f0,(openmode)((ulong)in_stack_fffffffffffff9e8 >> 0x20))
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff9e8);
  std::__cxx11::string::string(in_stack_fffffffffffffa00);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_2b0,local_2d0);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff9f8,(value_type *)in_stack_fffffffffffff9f0);
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9e8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,
               (unsigned_long)in_stack_fffffffffffff9e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffa28,
               (const_string *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
               (size_t)in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff9f0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_fffffffffffff9f0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff9f0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_fffffffffffff9f0);
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              (this_00,left_begin,in_RDI,right_begin,right_end);
    in_stack_fffffffffffffa28 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff9f0,(char (*) [1])in_stack_fffffffffffff9e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,
               (unsigned_long)in_stack_fffffffffffff9e8);
    in_stack_fffffffffffff9f8 = "log_lines.end()";
    in_stack_fffffffffffff9f0 = "log_lines.begin()";
    in_stack_fffffffffffff9e8 = (Logger *)&DAT_00000004;
    boost::test_tools::tt_detail::report_assertion
              (local_440,(lazy_ostream *)&stack0xfffffffffffffb98,
               (const_string *)&stack0xfffffffffffffb88,0xd7,CHECK,CHECK_EQUAL_COLL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff9e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff9e8);
    in_stack_fffffffffffffa27 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffa27);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff9f8);
  std::ifstream::~ifstream(local_2b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff9f8);
  if (*(pointer *)(in_FS_OFFSET + 0x28) != local_8._M_p) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_FIXTURE_TEST_CASE(logging_SeverityLevels, LogSetup)
{
    LogInstance().EnableCategory(BCLog::LogFlags::ALL);

    LogInstance().SetLogLevel(BCLog::Level::Debug);
    LogInstance().SetCategoryLogLevel(/*category_str=*/"net", /*level_str=*/"info");

    // Global log level
    LogPrintLevel(BCLog::HTTP, BCLog::Level::Info, "foo1: %s\n", "bar1");
    LogPrintLevel(BCLog::MEMPOOL, BCLog::Level::Trace, "foo2: %s. This log level is lower than the global one.\n", "bar2");
    LogPrintLevel(BCLog::VALIDATION, BCLog::Level::Warning, "foo3: %s\n", "bar3");
    LogPrintLevel(BCLog::RPC, BCLog::Level::Error, "foo4: %s\n", "bar4");

    // Category-specific log level
    LogPrintLevel(BCLog::NET, BCLog::Level::Warning, "foo5: %s\n", "bar5");
    LogPrintLevel(BCLog::NET, BCLog::Level::Debug, "foo6: %s. This log level is the same as the global one but lower than the category-specific one, which takes precedence. \n", "bar6");
    LogPrintLevel(BCLog::NET, BCLog::Level::Error, "foo7: %s\n", "bar7");

    std::vector<std::string> expected = {
        "[http:info] foo1: bar1",
        "[validation:warning] foo3: bar3",
        "[rpc:error] foo4: bar4",
        "[net:warning] foo5: bar5",
        "[net:error] foo7: bar7",
    };
    std::ifstream file{tmp_log_path};
    std::vector<std::string> log_lines;
    for (std::string log; std::getline(file, log);) {
        log_lines.push_back(log);
    }
    BOOST_CHECK_EQUAL_COLLECTIONS(log_lines.begin(), log_lines.end(), expected.begin(), expected.end());
}